

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_proxy_define_own_property
              (JSContext *ctx,JSValue obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter,
              int flags)

{
  JSObject *p;
  JSValue getter_00;
  JSValue getter_01;
  JSValue getter_02;
  JSValue setter_00;
  JSValue setter_01;
  JSValue setter_02;
  undefined4 uVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  int iVar4;
  BOOL BVar5;
  JSProxyData *pJVar6;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  char *fmt;
  JSValue v;
  JSValue v_00;
  JSValue func_obj;
  JSValue v_01;
  JSValue op1;
  JSValue JVar9;
  JSValue JVar10;
  JSValue op2;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSPropertyDescriptor desc;
  JSValue method;
  uint local_100;
  JSValueUnion local_e8;
  JSValueUnion JStack_e0;
  int64_t local_d8;
  JSValue local_d0;
  JSValueUnion local_c0;
  int64_t local_b8;
  int64_t local_b0;
  JSValueUnion local_a8;
  int64_t local_a0;
  JSValueUnion local_98;
  int64_t local_90;
  int64_t local_88;
  int64_t local_80;
  JSValueUnion local_78;
  ulong local_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  JVar9.tag = val.tag;
  local_a8 = val.u;
  pJVar6 = get_proxy_method(ctx,(JSValue *)&local_98,obj,0x65);
  if (pJVar6 == (JSProxyData *)0x0) {
    return -1;
  }
  local_b0 = JVar9.tag;
  if ((uint)local_90 == 3) {
    JVar9.u.ptr = local_a8.ptr;
    iVar4 = JS_DefineProperty(ctx,pJVar6->target,prop,JVar9,getter,setter,flags);
    return iVar4;
  }
  JVar9 = __JS_AtomToValue(ctx,prop,0);
  local_a0 = JVar9.tag;
  JVar7 = JVar9.u;
  if ((int)JVar9.tag == 6) goto LAB_00146a86;
  local_88 = getter.tag;
  local_78 = setter.u;
  local_80 = setter.tag;
  JVar9 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  JVar8 = JVar9.u;
  local_70 = JVar9.tag & 0xffffffff;
  if (local_70 != 6) {
    if (((uint)flags >> 0xb & 1) != 0) {
      local_e8 = getter.u;
      if (0xfffffff4 < (uint)local_88) {
        *(int *)getter.u.ptr = *getter.u.ptr + 1;
      }
      JVar10.tag = local_88;
      JVar10.u.float64 = getter.u.float64;
      JS_DefinePropertyValue(ctx,JVar9,0x41,JVar10,7);
    }
    if (((uint)flags >> 0xc & 1) != 0) {
      local_e8.float64 = local_78.float64;
      if (0xfffffff4 < (uint)local_80) {
        *(int *)local_78.ptr = *local_78.ptr + 1;
      }
      val_00.tag = local_80;
      val_00.u.ptr = local_78.ptr;
      JS_DefinePropertyValue(ctx,JVar9,0x42,val_00,7);
    }
    if (((uint)flags >> 0xd & 1) != 0) {
      local_e8.float64 = local_a8.float64;
      if (0xfffffff4 < (uint)local_b0) {
        *(int *)local_a8.ptr = *local_a8.ptr + 1;
      }
      val_01.tag = local_b0;
      val_01.u.ptr = local_a8.ptr;
      JS_DefinePropertyValue(ctx,JVar9,0x40,val_01,7);
    }
    JVar2 = local_e8;
    if (((uint)flags >> 9 & 1) != 0) {
      val_02.u._0_4_ = (uint)flags >> 1 & 1;
      val_02.u._4_4_ = 0;
      local_e8.float64 = local_e8.float64 & 0xffffffff00000000;
      JStack_e0.float64 = 1.48219693752374e-323;
      local_68.float64 = local_68.float64 & 0xffffffff00000000;
      iStack_60 = 3;
      getter_00.tag = 3;
      getter_00.u.float64 = JVar2.float64 & 0xffffffff00000000;
      setter_00.tag = 3;
      setter_00.u.ptr = local_68.ptr;
      val_02.tag = 1;
      JS_DefineProperty(ctx,JVar9,0x3e,val_02,getter_00,setter_00,0x2707);
    }
    JVar2 = local_e8;
    if (((uint)flags >> 10 & 1) != 0) {
      val_03.u._0_4_ = (uint)flags >> 2 & 1;
      val_03.u._4_4_ = 0;
      local_e8.float64 = local_e8.float64 & 0xffffffff00000000;
      JStack_e0.float64 = 1.48219693752374e-323;
      local_68.float64 = local_68.float64 & 0xffffffff00000000;
      iStack_60 = 3;
      getter_01.tag = 3;
      getter_01.u.float64 = JVar2.float64 & 0xffffffff00000000;
      setter_01.tag = 3;
      setter_01.u.ptr = local_68.ptr;
      val_03.tag = 1;
      JS_DefineProperty(ctx,JVar9,0x3f,val_03,getter_01,setter_01,0x2707);
    }
    JVar2 = local_e8;
    if (((uint)flags >> 8 & 1) != 0) {
      val_04.u._0_4_ = flags & 1;
      val_04.u._4_4_ = 0;
      local_e8.float64 = local_e8.float64 & 0xffffffff00000000;
      JStack_e0.float64 = 1.48219693752374e-323;
      local_68.float64 = local_68.float64 & 0xffffffff00000000;
      iStack_60 = 3;
      getter_02.tag = 3;
      getter_02.u.float64 = JVar2.float64 & 0xffffffff00000000;
      setter_02.tag = 3;
      setter_02.u.ptr = local_68.ptr;
      val_04.tag = 1;
      JS_DefineProperty(ctx,JVar9,0x3d,val_04,getter_02,setter_02,0x2707);
    }
    iVar3 = local_a0;
    if ((int)local_70 != 6) {
      local_68.ptr = *(void **)&(pJVar6->target).u;
      iStack_60 = (pJVar6->target).tag;
      local_50 = local_a0;
      func_obj.tag = local_90;
      func_obj.u.ptr = local_98.ptr;
      local_58 = JVar7;
      local_48 = JVar9;
      JVar10 = JS_CallFree(ctx,func_obj,pJVar6->handler,3,(JSValue *)&local_68);
      if ((0xfffffff4 < (uint)iVar3) &&
         (iVar4 = *JVar7.ptr, *(int *)JVar7.ptr = iVar4 + -1, iVar4 < 2)) {
        v_01.tag = iVar3;
        v_01.u.ptr = JVar7.ptr;
        local_e8 = JVar7;
        __JS_FreeValueRT(ctx->rt,v_01);
      }
      local_100 = (uint)JVar9.tag;
      local_e8 = JVar8;
      if ((0xfffffff4 < local_100) &&
         (iVar4 = *JVar8.ptr, *(int *)JVar8.ptr = iVar4 + -1, iVar4 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar9);
      }
      if ((int)JVar10.tag == 6) {
        return -1;
      }
      iVar4 = JS_ToBoolFree(ctx,JVar10);
      if (iVar4 == 0) {
        if (((uint)flags >> 0xe & 1) == 0) {
          return 0;
        }
        fmt = "proxy: defineProperty exception";
        goto LAB_00146c46;
      }
      p = (JSObject *)(pJVar6->target).u.ptr;
      iVar4 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)&local_e8,p,prop);
      JVar7 = local_e8;
      if (iVar4 < 0) {
        return -1;
      }
      if (iVar4 == 0) {
        if (((flags & 0x101U) != 0x100) && (((p->field_0).header.dummy1 & 1) != 0)) {
          return 1;
        }
      }
      else {
        uVar1 = local_e8.int32;
        BVar5 = check_define_prop_flags(local_e8.int32,flags);
        if ((BVar5 != 0) && (((flags & 0x101U) == 0x100 & JVar7._0_1_) == 0)) {
          if ((flags & 0x1800U) == 0) {
            if (((uint)flags >> 0xd & 1) != 0) {
              if ((flags & 2U) == 0 && (uVar1 & 3) == 2) goto LAB_00146c1c;
              local_c0 = JStack_e0;
              setter.tag = local_b0;
              setter.u = local_a8;
              if (((ulong)JVar7.ptr & 3) == 0) goto LAB_00146d21;
            }
          }
          else if ((uVar1 & 0x11) == 0x10) {
            if (((uint)flags >> 0xb & 1) != 0) {
              BVar5 = js_same_value(ctx,getter,local_d0);
              if (BVar5 == 0) goto LAB_00146c1c;
            }
            local_d8 = local_b8;
            if (((uint)flags >> 0xc & 1) != 0) {
LAB_00146d21:
              op1.tag = setter.tag;
              op1.u.float64 = setter.u.float64;
              op2.tag = local_d8;
              op2.u.float64 = local_c0.float64;
              BVar5 = js_same_value(ctx,op1,op2);
              if (BVar5 == 0) goto LAB_00146c1c;
            }
          }
          if ((((uint)flags >> 9 & 1) == 0) || ((local_e8.int32 & 0x13U) != 2)) {
            js_free_desc(ctx,(JSPropertyDescriptor *)&local_e8);
            return 1;
          }
        }
LAB_00146c1c:
        js_free_desc(ctx,(JSPropertyDescriptor *)&local_e8);
      }
      fmt = "proxy: inconsistent defineProperty";
LAB_00146c46:
      JS_ThrowTypeError(ctx,fmt);
      return -1;
    }
  }
  if ((0xfffffff4 < (uint)local_a0) &&
     (iVar4 = *JVar7.ptr, *(int *)JVar7.ptr = iVar4 + -1, iVar4 < 2)) {
    v.tag = local_a0;
    v.u.ptr = JVar7.ptr;
    local_e8 = JVar7;
    __JS_FreeValueRT(ctx->rt,v);
  }
LAB_00146a86:
  local_e8.float64 = local_98.float64;
  if ((0xfffffff4 < (uint)local_90) &&
     (iVar4 = *local_98.ptr, *(int *)local_98.ptr = iVar4 + -1, iVar4 < 2)) {
    v_00.tag = local_90;
    v_00.u.ptr = local_98.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  return -1;
}

Assistant:

static int js_proxy_define_own_property(JSContext *ctx, JSValueConst obj,
                                        JSAtom prop, JSValueConst val,
                                        JSValueConst getter, JSValueConst setter,
                                        int flags)
{
    JSProxyData *s;
    JSValue method, ret1, prop_val, desc_val;
    int res, ret;
    JSObject *p;
    JSValueConst args[3];
    JSPropertyDescriptor desc;
    BOOL setting_not_configurable;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_defineProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DefineProperty(ctx, s->target, prop, val, getter, setter, flags);
    }
    prop_val = JS_AtomToValue(ctx, prop);
    if (JS_IsException(prop_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    desc_val = js_create_desc(ctx, val, getter, setter, flags);
    if (JS_IsException(desc_val)) {
        JS_FreeValue(ctx, prop_val);
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = prop_val;
    args[2] = desc_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 3, args);
    JS_FreeValue(ctx, prop_val);
    JS_FreeValue(ctx, desc_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        if (flags & JS_PROP_THROW) {
            JS_ThrowTypeError(ctx, "proxy: defineProperty exception");
            return -1;
        } else {
            return 0;
        }
    }
    p = JS_VALUE_GET_OBJ(s->target);
    res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
    if (res < 0)
        return -1;
    setting_not_configurable = ((flags & (JS_PROP_HAS_CONFIGURABLE |
                                          JS_PROP_CONFIGURABLE)) ==
                                JS_PROP_HAS_CONFIGURABLE);
    if (!res) {
        if (!p->extensible || setting_not_configurable)
            goto fail;
    } else {
        if (!check_define_prop_flags(desc.flags, flags) ||
            ((desc.flags & JS_PROP_CONFIGURABLE) && setting_not_configurable)) {
            goto fail1;
        }
        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) ==
                JS_PROP_GETSET) {
                if ((flags & JS_PROP_HAS_GET) &&
                    !js_same_value(ctx, getter, desc.getter)) {
                    goto fail1;
                }
                if ((flags & JS_PROP_HAS_SET) &&
                    !js_same_value(ctx, setter, desc.setter)) {
                    goto fail1;
                }
            }
        } else if (flags & JS_PROP_HAS_VALUE) {
            if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) ==
                JS_PROP_WRITABLE && !(flags & JS_PROP_WRITABLE)) {
                /* missing-proxy-check feature */
                goto fail1;
            } else if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                !js_same_value(ctx, val, desc.value)) {
                goto fail1;
            }
        }
        if (flags & JS_PROP_HAS_WRITABLE) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE |
                               JS_PROP_WRITABLE)) == JS_PROP_WRITABLE) {
                /* proxy-missing-checks */
            fail1:
                js_free_desc(ctx, &desc);
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent defineProperty");
                return -1;
            }
        }
        js_free_desc(ctx, &desc);
    }
    return 1;
}